

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlUnloadFramebuffer(uint id)

{
  uint depthIdU;
  uint id_local;
  int depthId;
  int depthType;
  
  depthType = 0;
  depthId = 0;
  id_local = id;
  (*glad_glBindFramebuffer)(0x8d40,id);
  (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x8d00,0x8cd0,&depthType);
  (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x8d00,0x8cd1,&depthId);
  depthIdU = depthId;
  if (depthType == 0x8d41) {
    (*glad_glDeleteRenderbuffers)(1,&depthIdU);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glDeleteFramebuffers)(1,&id_local);
  TraceLog(3,"FBO: [ID %i] Unloaded framebuffer from VRAM (GPU)",(ulong)id_local);
  return;
}

Assistant:

void rlUnloadFramebuffer(unsigned int id)
{
#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(SUPPORT_RENDER_TEXTURES_HINT)

    // Query depth attachment to automatically delete texture/renderbuffer
    int depthType = 0, depthId = 0;
    glBindFramebuffer(GL_FRAMEBUFFER, id);   // Bind framebuffer to query depth texture type
    glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &depthType);
    glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &depthId);

    unsigned int depthIdU = (unsigned int)depthId;
    if (depthType == GL_RENDERBUFFER) glDeleteRenderbuffers(1, &depthIdU);
    else if (depthType == GL_RENDERBUFFER) glDeleteTextures(1, &depthIdU);

    // NOTE: If a texture object is deleted while its image is attached to the *currently bound* framebuffer,
    // the texture image is automatically detached from the currently bound framebuffer.

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glDeleteFramebuffers(1, &id);

    TRACELOG(LOG_INFO, "FBO: [ID %i] Unloaded framebuffer from VRAM (GPU)", id);
#endif
}